

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_Curve * __thiscall ON_PlaneSurface::IsoCurve(ON_PlaneSurface *this,int dir,double c)

{
  uint uVar1;
  double *pdVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  undefined1 local_68 [8];
  ON_Interval domain;
  ON_Line line;
  ON_LineCurve *line_curve;
  double c_local;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  line.to.z = 0.0;
  if (((dir == 0) || (dir == 1)) &&
     (uVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                        (this,0), (uVar1 & 1) != 0)) {
    ON_Line::ON_Line((ON_Line *)(domain.m_t + 1));
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    local_68 = (undefined1  [8])CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    domain.m_t[0] = in_XMM1_Qa;
    if (dir == 1) {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)local_68,0);
      ON_Surface::PointAt(&local_90,&this->super_ON_Surface,c,*pdVar2);
      domain.m_t[1] = local_90.x;
      pdVar2 = ON_Interval::operator[]((ON_Interval *)local_68,1);
      ON_Surface::PointAt(&local_a8,&this->super_ON_Surface,c,*pdVar2);
    }
    else {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)local_68,0);
      ON_Surface::PointAt(&local_c0,&this->super_ON_Surface,*pdVar2,c);
      domain.m_t[1] = local_c0.x;
      pdVar2 = ON_Interval::operator[]((ON_Interval *)local_68,1);
      ON_Surface::PointAt(&local_d8,&this->super_ON_Surface,*pdVar2,c);
    }
    line.to.z = (double)operator_new(0x58);
    ON_LineCurve::ON_LineCurve((ON_LineCurve *)line.to.z,(ON_Line *)(domain.m_t + 1));
    ((ON_LineCurve *)line.to.z)->m_dim = 3;
    (((ON_LineCurve *)line.to.z)->m_t).m_t[0] = (double)local_68;
    (((ON_LineCurve *)line.to.z)->m_t).m_t[1] = domain.m_t[0];
    ON_Line::~ON_Line((ON_Line *)(domain.m_t + 1));
  }
  return (ON_Curve *)line.to.z;
}

Assistant:

ON_Curve* ON_PlaneSurface::IsoCurve( int dir, double c ) const
{
  ON_LineCurve* line_curve = 0;
  if ( (dir == 0 || dir == 1) && IsValid() ) 
  {
    ON_Line line;
    ON_Interval domain = Domain(dir);
    if ( dir == 1 )
    {
      line.from = PointAt( c, domain[0] );
      line.to = PointAt( c, domain[1] );
    }
    else
    {
      line.from = PointAt( domain[0], c );
      line.to = PointAt( domain[1], c );
    }
    line_curve = new ON_LineCurve(line);
    line_curve->m_dim = 3;
    line_curve->m_t = domain;
  }
  return line_curve;
}